

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O2

unsigned_short process_metadata(fb_parser_t *P,fb_metadata_t *m,uint16_t expect,fb_metadata_t **out)

{
  uint uVar1;
  fb_name_t *pfVar2;
  ulong uVar3;
  undefined6 in_register_00000012;
  char *msg;
  uint uVar4;
  fb_token_t *t;
  int iVar5;
  
  out[0xc] = (fb_metadata_t *)0x0;
  out[0xd] = (fb_metadata_t *)0x0;
  out[10] = (fb_metadata_t *)0x0;
  out[0xb] = (fb_metadata_t *)0x0;
  out[8] = (fb_metadata_t *)0x0;
  out[9] = (fb_metadata_t *)0x0;
  out[6] = (fb_metadata_t *)0x0;
  out[7] = (fb_metadata_t *)0x0;
  out[4] = (fb_metadata_t *)0x0;
  out[5] = (fb_metadata_t *)0x0;
  out[2] = (fb_metadata_t *)0x0;
  out[3] = (fb_metadata_t *)0x0;
  *out = (fb_metadata_t *)0x0;
  out[1] = (fb_metadata_t *)0x0;
  iVar5 = -100;
  uVar4 = 0;
  do {
    if ((m == (fb_metadata_t *)0x0) || (iVar5 == 0)) {
      if (m != (fb_metadata_t *)0x0) {
        error_tok(P,m->ident,"too many attributes");
      }
      return (unsigned_short)uVar4;
    }
    pfVar2 = fb_name_table_find(&((P->schema).root_schema)->attribute_index,m->ident->text,
                                m->ident->len);
    if (pfVar2 == (fb_name_t *)0x0) {
      t = m->ident;
      msg = "unknown attribute not declared";
      goto LAB_0011e349;
    }
    uVar1 = *(uint *)&pfVar2[1].link;
    uVar3 = (ulong)uVar1;
    if (uVar3 == 0) goto switchD_0011e395_caseD_2;
    if (((uint)CONCAT62(in_register_00000012,expect) >> (uVar1 & 0x1f) & 1) == 0) {
      t = m->ident;
      msg = "known attribute not expected in this context";
LAB_0011e349:
      error_tok(P,t,msg);
    }
    else {
      uVar4 = uVar4 | 1 << ((byte)uVar1 & 0x1f);
      if (out[uVar3] != (fb_metadata_t *)0x0) {
        t = m->ident;
        msg = "known attribute listed multiple times";
        goto LAB_0011e349;
      }
      out[uVar3] = m;
      if (((0x3dacUL >> (uVar3 & 0x3f) & 1) != 0) && ((m->value).type != 0)) {
        t = m->ident;
        msg = "known attribute does not expect a value";
        goto LAB_0011e349;
      }
      switch(uVar1) {
      case 1:
      case 4:
        if ((m->value).type != 6) {
          t = m->ident;
          msg = "known attribute expects an unsigned integer";
          goto LAB_0011e349;
        }
        break;
      case 6:
      case 9:
        if ((m->value).type != 3) {
          t = m->ident;
          msg = "known attribute expects a string";
          goto LAB_0011e349;
        }
      }
    }
switchD_0011e395_caseD_2:
    m = m->link;
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

static inline unsigned short process_metadata(fb_parser_t *P, fb_metadata_t *m,
        uint16_t expect, fb_metadata_t *out[KNOWN_ATTR_COUNT])
{
    uint16_t flags;
    unsigned int i, n = FLATCC_ATTR_MAX;
    int type;
    fb_attribute_t *a;

    memset(out, 0, sizeof(out[0]) * KNOWN_ATTR_COUNT);
    for (flags = 0; m && n; --n, m = m->link) {
        a = (fb_attribute_t *)find_fb_name_by_token(&P->schema.root_schema->attribute_index, m->ident);
        if (!a) {
            error_tok(P, m->ident, "unknown attribute not declared");
            continue;
        }
        if (!(i = a->known)) {
            continue;
        }
        if (!((1 << i) & expect)) {
            error_tok(P, m->ident, "known attribute not expected in this context");
            continue;
        }
        flags |= 1 << i;
        if (out[i]) {
            error_tok(P, m->ident, "known attribute listed multiple times");
            continue;
        }
        out[i] = m;
        type = fb_known_attribute_types[i];
        if (type == vt_missing && m->value.type != vt_missing) {
            error_tok(P, m->ident, "known attribute does not expect a value");
            continue;
        }
        if (type == vt_string && m->value.type != vt_string) {
            error_tok(P, m->ident, "known attribute expects a string");
            continue;
        }
        if (type == vt_uint && m->value.type != vt_uint) {
            error_tok(P, m->ident, "known attribute expects an unsigned integer");
            continue;
        }
        if (type == vt_int && m->value.type != vt_uint && m->value.type != vt_int) {
            error_tok(P, m->ident, "known attribute expects an integer");
            continue;
        }
        if (type == vt_bool && m->value.type != vt_bool) {
            error_tok(P, m->ident, "known attribute expects 'true' or 'false'");
            continue;
        }
    }
    if (m) {
        error_tok(P, m->ident, "too many attributes");
    }
    return flags;
}